

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

void __thiscall BMP::buildingCodeHuffman(BMP *this)

{
  GreyCount *pGVar1;
  HuffmanTree *pHVar2;
  HuffmanTree *pHVar3;
  long lVar4;
  long lVar5;
  Alphabet *pAVar6;
  string code;
  priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
  local_78;
  string local_50;
  
  local_78.c.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.c.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.c.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar6 = this->alphabet;
  if (0 < pAVar6->num) {
    lVar5 = 0x60;
    lVar4 = 0;
    do {
      local_50._M_dataplus._M_p = (pointer)operator_new(0x30);
      pGVar1 = pAVar6->symbol;
      *(longdouble *)local_50._M_dataplus._M_p = *(longdouble *)((long)pGVar1 + lVar5 + -0x50);
      *(int *)((long)local_50._M_dataplus._M_p + 0x10) = (int)lVar4;
      *(undefined8 *)((long)local_50._M_dataplus._M_p + 0x18) = 0;
      *(undefined8 *)((long)local_50._M_dataplus._M_p + 0x20) = 0;
      std::__cxx11::string::_M_replace
                ((long)&pGVar1->num + lVar5,0,*(char **)(&pGVar1->field_0x8 + lVar5),0x1082dc);
      std::
      priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
      ::push(&local_78,(value_type *)&local_50);
      lVar4 = lVar4 + 1;
      pAVar6 = this->alphabet;
      lVar5 = lVar5 + 0x80;
    } while (lVar4 < pAVar6->num);
  }
  if (8 < (ulong)((long)local_78.c.
                        super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.c.
                       super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    do {
      pHVar2 = *local_78.c.
                super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      std::
      priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
      ::pop(&local_78);
      pHVar3 = *local_78.c.
                super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      std::
      priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
      ::pop(&local_78);
      local_50._M_dataplus._M_p = (pointer)operator_new(0x30);
      *(HuffmanTree **)((long)local_50._M_dataplus._M_p + 0x18) = pHVar2;
      *(HuffmanTree **)((long)local_50._M_dataplus._M_p + 0x20) = pHVar3;
      *(longdouble *)local_50._M_dataplus._M_p = pHVar3->frq + pHVar2->frq;
      *(undefined4 *)((long)local_50._M_dataplus._M_p + 0x10) = 0xffffffff;
      std::
      priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
      ::push(&local_78,(value_type *)&local_50);
    } while (8 < (ulong)((long)local_78.c.
                               super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_78.c.
                              super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>
                              ._M_impl.super__Vector_impl_data._M_start));
  }
  pHVar2 = *local_78.c.
            super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  fun(this,pHVar2,&local_50);
  del(pHVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_78.c.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.c.
                    super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BMP::buildingCodeHuffman()
{
    using namespace bitMap;
    using namespace std;

    auto comp = []( HuffmanTree *a, HuffmanTree*b ){ return a->frq > b->frq; };

    priority_queue< HuffmanTree*, vector< HuffmanTree* >, decltype( comp ) > qu(comp);

    for ( auto i = 0; i < alphabet->num; i++ ){
        HuffmanTree *obj = new HuffmanTree( alphabet->symbol[ i ].frq, i, nullptr, nullptr );
        alphabet->symbol[ i ].codeHuffman = "";
        qu.push( obj );
    }


    while( qu.size() > 1 ){
        HuffmanTree *l = qu.top();
        qu.pop();
        HuffmanTree *r = qu.top();
        qu.pop();

        HuffmanTree *root = new HuffmanTree( l ,r );

        qu.push(root);
    }

    HuffmanTree *root = qu.top();

    string code = "";
    fun( root, code );
    del( root );
}